

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_515e1e::HandleStringsCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  char cVar1;
  string_view value;
  cmExecutionStatus *pcVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  BOM BVar6;
  uint uVar7;
  size_type sVar8;
  const_reference pvVar9;
  cmMakefile *pcVar10;
  string *psVar11;
  undefined8 uVar12;
  char *pcVar13;
  streamoff sVar14;
  long lVar15;
  ulong uVar16;
  reference pcVar17;
  bool local_ac5;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_a18;
  char i_2;
  const_iterator __end2;
  const_iterator __begin2;
  string *__range2;
  string *sr;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  string output;
  char *sep;
  uint local_9b0;
  uint j_2;
  uint j_1;
  uint j;
  uint num_utf8_bytes;
  int c1;
  uint i_1;
  int c;
  string current_str;
  undefined1 local_968 [8];
  string s;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  strings;
  uint local_928;
  int output_size;
  uint bytes_rem;
  int bom_found;
  cmAlphaNum local_8f0;
  string local_8c0;
  long local_8a0;
  ifstream fin;
  cmAlphaNum local_698;
  cmAlphaNum local_668;
  undefined1 local_638 [8];
  string binaryFileName;
  cmAlphaNum local_5e8;
  string local_5b8;
  cmAlphaNum local_598;
  cmAlphaNum local_568;
  string local_538;
  cmAlphaNum local_518;
  cmAlphaNum local_4e8;
  string local_4b8;
  cmAlphaNum local_498;
  cmAlphaNum local_468;
  string local_438;
  int local_414;
  undefined1 local_410 [4];
  int len_1;
  cmAlphaNum local_3e0;
  string local_3b0;
  int local_38c;
  undefined1 local_388 [4];
  int len;
  cmAlphaNum local_358;
  string local_328;
  int local_304;
  undefined1 local_300 [4];
  int count;
  cmAlphaNum local_2d0;
  string local_2a0;
  int local_27c;
  cmAlphaNum local_278;
  cmAlphaNum local_248;
  string local_218;
  uint local_1f8;
  int local_1f4;
  uint i;
  int arg_mode;
  int encoding;
  bool hex_conversion_enabled;
  bool newline_consume;
  bool have_regex;
  RegularExpression regex;
  int local_110;
  uint limit_count;
  int limit_output;
  int limit_input;
  uint maxlen;
  uint minlen;
  string *outVar;
  cmAlphaNum local_c8;
  string local_98;
  undefined1 local_78 [8];
  string fileName;
  allocator<char> local_41;
  string local_40;
  cmExecutionStatus *local_20;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  local_20 = status;
  status_local = (cmExecutionStatus *)args;
  sVar8 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  pcVar2 = local_20;
  if (sVar8 < 3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"STRINGS requires a file name and output variable",&local_41);
    cmExecutionStatus::SetError(pcVar2,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    args_local._7_1_ = 0;
  }
  else {
    pvVar9 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)status_local,1);
    std::__cxx11::string::string((string *)local_78,(string *)pvVar9);
    bVar3 = cmsys::SystemTools::FileIsFullPath((string *)local_78);
    if (!bVar3) {
      pcVar10 = cmExecutionStatus::GetMakefile(local_20);
      psVar11 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(pcVar10);
      cmAlphaNum::cmAlphaNum(&local_c8,psVar11);
      cmAlphaNum::cmAlphaNum((cmAlphaNum *)&outVar,'/');
      pvVar9 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)status_local,1);
      cmStrCat<std::__cxx11::string>(&local_98,&local_c8,(cmAlphaNum *)&outVar,pvVar9);
      std::__cxx11::string::operator=((string *)local_78,(string *)&local_98);
      std::__cxx11::string::~string((string *)&local_98);
    }
    _maxlen = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)status_local,2);
    limit_input = 0;
    limit_output = 0;
    limit_count = 0xffffffff;
    local_110 = -1;
    regex._204_4_ = 0;
    cmsys::RegularExpression::RegularExpression((RegularExpression *)&encoding);
    arg_mode._3_1_ = 0;
    arg_mode._2_1_ = 0;
    arg_mode._1_1_ = 1;
    i = 0;
    local_1f4 = 0;
    for (local_1f8 = 3; uVar16 = (ulong)local_1f8,
        sVar8 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)status_local), uVar16 < sVar8; local_1f8 = local_1f8 + 1) {
      pvVar9 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)status_local,(ulong)local_1f8);
      bVar3 = std::operator==(pvVar9,"LIMIT_INPUT");
      if (bVar3) {
        local_1f4 = 1;
      }
      else {
        pvVar9 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)status_local,(ulong)local_1f8);
        bVar3 = std::operator==(pvVar9,"LIMIT_OUTPUT");
        if (bVar3) {
          local_1f4 = 2;
        }
        else {
          pvVar9 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)status_local,(ulong)local_1f8);
          bVar3 = std::operator==(pvVar9,"LIMIT_COUNT");
          if (bVar3) {
            local_1f4 = 3;
          }
          else {
            pvVar9 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)status_local,(ulong)local_1f8);
            bVar3 = std::operator==(pvVar9,"LENGTH_MINIMUM");
            if (bVar3) {
              local_1f4 = 4;
            }
            else {
              pvVar9 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)status_local,(ulong)local_1f8);
              bVar3 = std::operator==(pvVar9,"LENGTH_MAXIMUM");
              if (bVar3) {
                local_1f4 = 5;
              }
              else {
                pvVar9 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)status_local,(ulong)local_1f8);
                bVar3 = std::operator==(pvVar9,"REGEX");
                if (bVar3) {
                  local_1f4 = 7;
                }
                else {
                  pvVar9 = std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)status_local,(ulong)local_1f8);
                  bVar3 = std::operator==(pvVar9,"NEWLINE_CONSUME");
                  if (bVar3) {
                    arg_mode._2_1_ = 1;
                    local_1f4 = 0;
                  }
                  else {
                    pvVar9 = std::
                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           *)status_local,(ulong)local_1f8);
                    bVar3 = std::operator==(pvVar9,"NO_HEX_CONVERSION");
                    if (bVar3) {
                      arg_mode._1_1_ = 0;
                      local_1f4 = 0;
                    }
                    else {
                      pvVar9 = std::
                               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             *)status_local,(ulong)local_1f8);
                      bVar3 = std::operator==(pvVar9,"ENCODING");
                      pcVar2 = local_20;
                      if (bVar3) {
                        local_1f4 = 8;
                      }
                      else {
                        if (local_1f4 == 1) {
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)status_local,(ulong)local_1f8);
                          uVar12 = std::__cxx11::string::c_str();
                          iVar5 = __isoc99_sscanf(uVar12,"%d",&limit_count);
                          pcVar2 = local_20;
                          if ((iVar5 != 1) || ((int)limit_count < 0)) {
                            cmAlphaNum::cmAlphaNum(&local_248,"STRINGS option LIMIT_INPUT value \"")
                            ;
                            pvVar9 = std::
                                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)status_local,(ulong)local_1f8);
                            cmAlphaNum::cmAlphaNum(&local_278,pvVar9);
                            cmStrCat<char[30]>(&local_218,&local_248,&local_278,
                                               (char (*) [30])"\" is not an unsigned integer.");
                            cmExecutionStatus::SetError(pcVar2,&local_218);
                            std::__cxx11::string::~string((string *)&local_218);
                            args_local._7_1_ = 0;
                            local_27c = 1;
                            goto LAB_003b094f;
                          }
                        }
                        else if (local_1f4 == 2) {
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)status_local,(ulong)local_1f8);
                          uVar12 = std::__cxx11::string::c_str();
                          iVar5 = __isoc99_sscanf(uVar12,"%d",&local_110);
                          pcVar2 = local_20;
                          if ((iVar5 != 1) || (local_110 < 0)) {
                            cmAlphaNum::cmAlphaNum
                                      (&local_2d0,"STRINGS option LIMIT_OUTPUT value \"");
                            pvVar9 = std::
                                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)status_local,(ulong)local_1f8);
                            cmAlphaNum::cmAlphaNum((cmAlphaNum *)local_300,pvVar9);
                            cmStrCat<char[30]>(&local_2a0,&local_2d0,(cmAlphaNum *)local_300,
                                               (char (*) [30])"\" is not an unsigned integer.");
                            cmExecutionStatus::SetError(pcVar2,&local_2a0);
                            std::__cxx11::string::~string((string *)&local_2a0);
                            args_local._7_1_ = 0;
                            local_27c = 1;
                            goto LAB_003b094f;
                          }
                        }
                        else if (local_1f4 == 3) {
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)status_local,(ulong)local_1f8);
                          uVar12 = std::__cxx11::string::c_str();
                          iVar5 = __isoc99_sscanf(uVar12,"%d",&local_304);
                          pcVar2 = local_20;
                          if ((iVar5 != 1) || (local_304 < 0)) {
                            cmAlphaNum::cmAlphaNum(&local_358,"STRINGS option LIMIT_COUNT value \"")
                            ;
                            pvVar9 = std::
                                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)status_local,(ulong)local_1f8);
                            cmAlphaNum::cmAlphaNum((cmAlphaNum *)local_388,pvVar9);
                            cmStrCat<char[30]>(&local_328,&local_358,(cmAlphaNum *)local_388,
                                               (char (*) [30])"\" is not an unsigned integer.");
                            cmExecutionStatus::SetError(pcVar2,&local_328);
                            std::__cxx11::string::~string((string *)&local_328);
                            args_local._7_1_ = 0;
                            local_27c = 1;
                            goto LAB_003b094f;
                          }
                          regex._204_4_ = local_304;
                        }
                        else if (local_1f4 == 4) {
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)status_local,(ulong)local_1f8);
                          uVar12 = std::__cxx11::string::c_str();
                          iVar5 = __isoc99_sscanf(uVar12,"%d",&local_38c);
                          pcVar2 = local_20;
                          if ((iVar5 != 1) || (local_38c < 0)) {
                            cmAlphaNum::cmAlphaNum
                                      (&local_3e0,"STRINGS option LENGTH_MINIMUM value \"");
                            pvVar9 = std::
                                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)status_local,(ulong)local_1f8);
                            cmAlphaNum::cmAlphaNum((cmAlphaNum *)local_410,pvVar9);
                            cmStrCat<char[30]>(&local_3b0,&local_3e0,(cmAlphaNum *)local_410,
                                               (char (*) [30])"\" is not an unsigned integer.");
                            cmExecutionStatus::SetError(pcVar2,&local_3b0);
                            std::__cxx11::string::~string((string *)&local_3b0);
                            args_local._7_1_ = 0;
                            local_27c = 1;
                            goto LAB_003b094f;
                          }
                          limit_input = local_38c;
                        }
                        else if (local_1f4 == 5) {
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)status_local,(ulong)local_1f8);
                          uVar12 = std::__cxx11::string::c_str();
                          iVar5 = __isoc99_sscanf(uVar12,"%d",&local_414);
                          pcVar2 = local_20;
                          if ((iVar5 != 1) || (local_414 < 0)) {
                            cmAlphaNum::cmAlphaNum
                                      (&local_468,"STRINGS option LENGTH_MAXIMUM value \"");
                            pvVar9 = std::
                                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)status_local,(ulong)local_1f8);
                            cmAlphaNum::cmAlphaNum(&local_498,pvVar9);
                            cmStrCat<char[30]>(&local_438,&local_468,&local_498,
                                               (char (*) [30])"\" is not an unsigned integer.");
                            cmExecutionStatus::SetError(pcVar2,&local_438);
                            std::__cxx11::string::~string((string *)&local_438);
                            args_local._7_1_ = 0;
                            local_27c = 1;
                            goto LAB_003b094f;
                          }
                          limit_output = local_414;
                        }
                        else if (local_1f4 == 7) {
                          pvVar9 = std::
                                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 *)status_local,(ulong)local_1f8);
                          bVar3 = cmsys::RegularExpression::compile
                                            ((RegularExpression *)&encoding,pvVar9);
                          pcVar2 = local_20;
                          if (!bVar3) {
                            cmAlphaNum::cmAlphaNum(&local_4e8,"STRINGS option REGEX value \"");
                            pvVar9 = std::
                                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)status_local,(ulong)local_1f8);
                            cmAlphaNum::cmAlphaNum(&local_518,pvVar9);
                            cmStrCat<char[25]>(&local_4b8,&local_4e8,&local_518,
                                               (char (*) [25])"\" could not be compiled.");
                            cmExecutionStatus::SetError(pcVar2,&local_4b8);
                            std::__cxx11::string::~string((string *)&local_4b8);
                            args_local._7_1_ = 0;
                            local_27c = 1;
                            goto LAB_003b094f;
                          }
                          arg_mode._3_1_ = 1;
                        }
                        else {
                          if (local_1f4 != 8) {
                            cmAlphaNum::cmAlphaNum(&local_5e8,"STRINGS given unknown argument \"");
                            pvVar9 = std::
                                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)status_local,(ulong)local_1f8);
                            cmAlphaNum::cmAlphaNum
                                      ((cmAlphaNum *)((long)&binaryFileName.field_2 + 8),pvVar9);
                            cmStrCat<char[2]>(&local_5b8,&local_5e8,
                                              (cmAlphaNum *)((long)&binaryFileName.field_2 + 8),
                                              (char (*) [2])0xc4a1e0);
                            cmExecutionStatus::SetError(pcVar2,&local_5b8);
                            std::__cxx11::string::~string((string *)&local_5b8);
                            args_local._7_1_ = 0;
                            local_27c = 1;
                            goto LAB_003b094f;
                          }
                          pvVar9 = std::
                                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 *)status_local,(ulong)local_1f8);
                          bVar3 = std::operator==(pvVar9,"UTF-8");
                          if (bVar3) {
                            i = 1;
                          }
                          else {
                            pvVar9 = std::
                                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)status_local,(ulong)local_1f8);
                            bVar3 = std::operator==(pvVar9,"UTF-16LE");
                            if (bVar3) {
                              i = 3;
                            }
                            else {
                              pvVar9 = std::
                                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)status_local,(ulong)local_1f8);
                              bVar3 = std::operator==(pvVar9,"UTF-16BE");
                              if (bVar3) {
                                i = 2;
                              }
                              else {
                                pvVar9 = std::
                                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)status_local,(ulong)local_1f8);
                                bVar3 = std::operator==(pvVar9,"UTF-32LE");
                                if (bVar3) {
                                  i = 5;
                                }
                                else {
                                  pvVar9 = std::
                                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)status_local,(ulong)local_1f8);
                                  bVar3 = std::operator==(pvVar9,"UTF-32BE");
                                  pcVar2 = local_20;
                                  if (!bVar3) {
                                    cmAlphaNum::cmAlphaNum(&local_568,"STRINGS option ENCODING \"");
                                    pvVar9 = std::
                                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)status_local,(ulong)local_1f8);
                                    cmAlphaNum::cmAlphaNum(&local_598,pvVar9);
                                    cmStrCat<char[18]>(&local_538,&local_568,&local_598,
                                                       (char (*) [18])"\" not recognized.");
                                    cmExecutionStatus::SetError(pcVar2,&local_538);
                                    std::__cxx11::string::~string((string *)&local_538);
                                    args_local._7_1_ = 0;
                                    local_27c = 1;
                                    goto LAB_003b094f;
                                  }
                                  i = 4;
                                }
                              }
                            }
                          }
                        }
                        local_1f4 = 0;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    if ((arg_mode._1_1_ & 1) != 0) {
      pcVar10 = cmExecutionStatus::GetMakefile(local_20);
      psVar11 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(pcVar10);
      cmAlphaNum::cmAlphaNum(&local_668,psVar11);
      cmAlphaNum::cmAlphaNum(&local_698,"/CMakeFiles/FileCommandStringsBinaryFile");
      cmStrCat<>((string *)local_638,&local_668,&local_698);
      bVar3 = cmHexFileConverter::TryConvert((string *)local_78,(string *)local_638);
      if (bVar3) {
        std::__cxx11::string::operator=((string *)local_78,(string *)local_638);
      }
      std::__cxx11::string::~string((string *)local_638);
    }
    pcVar13 = (char *)std::__cxx11::string::c_str();
    std::ifstream::ifstream(&local_8a0,pcVar13,_S_in);
    bVar4 = std::ios::operator!((ios *)((long)&local_8a0 + *(long *)(local_8a0 + -0x18)));
    pcVar2 = local_20;
    if ((bVar4 & 1) == 0) {
      BVar6 = cmsys::FStream::ReadBOM((istream *)&local_8a0);
      if ((i == 0) && (BVar6 != BOM_None)) {
        i = BVar6;
      }
      local_928 = 0;
      if ((i == 3) || (i == 2)) {
        local_928 = 1;
      }
      if ((i == 5) || (i == 4)) {
        local_928 = 3;
      }
      strings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&s.field_2 + 8));
      std::__cxx11::string::string((string *)local_968);
      do {
        if (regex._204_4_ == 0) {
LAB_003afe79:
          if (-1 < (int)limit_count) {
            current_str.field_2._8_8_ = std::istream::tellg();
            sVar14 = std::fpos::operator_cast_to_long
                               ((fpos *)(current_str.field_2._M_local_buf + 8));
            local_ac5 = false;
            if ((int)limit_count <= (int)sVar14) goto LAB_003aff16;
          }
          local_ac5 = std::ios::operator_cast_to_bool
                                ((ios *)((long)&local_8a0 + *(long *)(local_8a0 + -0x18)));
        }
        else {
          sVar8 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)((long)&s.field_2 + 8));
          local_ac5 = false;
          if (sVar8 < (uint)regex._204_4_) goto LAB_003afe79;
        }
LAB_003aff16:
        if (local_ac5 == false) break;
        std::__cxx11::string::string((string *)&i_1);
        c1 = std::istream::get();
        for (num_utf8_bytes = 0; num_utf8_bytes < local_928; num_utf8_bytes = num_utf8_bytes + 1) {
          uVar7 = std::istream::get();
          bVar4 = std::ios::operator!((ios *)((long)&local_8a0 + *(long *)(local_8a0 + -0x18)));
          if ((bVar4 & 1) != 0) {
            std::istream::putback((char)&local_8a0);
            break;
          }
          c1 = c1 << 8 | uVar7;
        }
        if (i == 3) {
          c1 = (c1 & 0xffU) << 8 | (int)(c1 & 0xff00U) >> 8;
        }
        else if (i == 5) {
          c1 = c1 << 0x18 | (c1 & 0xff00U) << 8 | (int)(c1 & 0xff0000U) >> 8 | (uint)c1 >> 0x18;
        }
        if (c1 == 0xd) {
          local_27c = 5;
        }
        else {
          if (((c1 < 0) || (0xff < c1)) ||
             (((iVar5 = isprint(c1), iVar5 == 0 && (c1 != 9)) &&
              ((c1 != 10 || ((arg_mode._2_1_ & 1) == 0)))))) {
            if (i == 1) {
              j_1 = 0;
              for (j_2 = 0; j_1 == 0 && j_2 < 3; j_2 = j_2 + 1) {
                if ((c1 & (uint)HandleStringsCommand::utf8_check_table[j_2][0]) ==
                    (uint)HandleStringsCommand::utf8_check_table[j_2][1]) {
                  j_1 = j_2 + 2;
                }
              }
              for (local_9b0 = 0; local_9b0 < j_1; local_9b0 = local_9b0 + 1) {
                if (local_9b0 != 0) {
                  c1 = std::istream::get();
                  bVar4 = std::ios::operator!((ios *)((long)&local_8a0 +
                                                     *(long *)(local_8a0 + -0x18)));
                  if (((bVar4 & 1) != 0) || ((c1 & 0xc0U) != 0x80)) {
                    std::istream::putback((char)&local_8a0);
                    break;
                  }
                }
                std::__cxx11::string::operator+=((string *)&i_1,(char)c1);
              }
              uVar16 = std::__cxx11::string::length();
              if (uVar16 != j_1) {
                for (sep._4_4_ = 0; lVar15 = std::__cxx11::string::size(),
                    (ulong)sep._4_4_ < lVar15 - 1U; sep._4_4_ = sep._4_4_ + 1) {
                  std::__cxx11::string::size();
                  std::__cxx11::string::operator[]((ulong)&i_1);
                  std::istream::putback((char)&local_8a0);
                }
                std::__cxx11::string::clear();
              }
            }
          }
          else {
            std::__cxx11::string::operator+=((string *)&i_1,(char)c1);
          }
          if ((c1 == 10) && ((arg_mode._2_1_ & 1) == 0)) {
            uVar16 = std::__cxx11::string::length();
            if (((uint)limit_input <= uVar16) &&
               (((arg_mode._3_1_ & 1) == 0 ||
                (bVar3 = cmsys::RegularExpression::find
                                   ((RegularExpression *)&encoding,(string *)local_968), bVar3)))) {
              iVar5 = std::__cxx11::string::size();
              strings.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
                   iVar5 + 1 +
                   strings.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
              if ((-1 < local_110) &&
                 (local_110 <=
                  strings.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_)) {
                std::__cxx11::string::clear();
                local_27c = 6;
                goto LAB_003b0610;
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)((long)&s.field_2 + 8),(value_type *)local_968);
            }
            std::__cxx11::string::clear();
          }
          else {
            uVar16 = std::__cxx11::string::empty();
            if ((uVar16 & 1) == 0) {
              std::__cxx11::string::operator+=((string *)local_968,(string *)&i_1);
            }
            else {
              uVar16 = std::__cxx11::string::length();
              if ((((uint)limit_input <= uVar16) &&
                  (uVar16 = std::__cxx11::string::empty(), (uVar16 & 1) == 0)) &&
                 (((arg_mode._3_1_ & 1) == 0 ||
                  (bVar3 = cmsys::RegularExpression::find
                                     ((RegularExpression *)&encoding,(string *)local_968), bVar3))))
              {
                iVar5 = std::__cxx11::string::size();
                strings.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
                     iVar5 + 1 +
                     strings.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
                if ((-1 < local_110) &&
                   (local_110 <=
                    strings.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_)) {
                  std::__cxx11::string::clear();
                  local_27c = 6;
                  goto LAB_003b0610;
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)((long)&s.field_2 + 8),(value_type *)local_968);
              }
              std::__cxx11::string::clear();
            }
          }
          if ((limit_output != 0) &&
             (uVar16 = std::__cxx11::string::size(), uVar16 == (uint)limit_output)) {
            uVar16 = std::__cxx11::string::length();
            if (((uint)limit_input <= uVar16) &&
               (((arg_mode._3_1_ & 1) == 0 ||
                (bVar3 = cmsys::RegularExpression::find
                                   ((RegularExpression *)&encoding,(string *)local_968), bVar3)))) {
              iVar5 = std::__cxx11::string::size();
              strings.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
                   iVar5 + 1 +
                   strings.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
              if ((-1 < local_110) &&
                 (local_110 <=
                  strings.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_)) {
                std::__cxx11::string::clear();
                local_27c = 6;
                goto LAB_003b0610;
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)((long)&s.field_2 + 8),(value_type *)local_968);
            }
            std::__cxx11::string::clear();
          }
          local_27c = 0;
        }
LAB_003b0610:
        std::__cxx11::string::~string((string *)&i_1);
      } while ((local_27c == 0) || (local_27c == 5));
      if ((((regex._204_4_ == 0) ||
           (sVar8 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)((long)&s.field_2 + 8)), sVar8 < (uint)regex._204_4_)) &&
          ((uVar16 = std::__cxx11::string::empty(), (uVar16 & 1) == 0 &&
           (uVar16 = std::__cxx11::string::length(), (uint)limit_input <= uVar16)))) &&
         (((arg_mode._3_1_ & 1) == 0 ||
          (bVar3 = cmsys::RegularExpression::find
                             ((RegularExpression *)&encoding,(string *)local_968), bVar3)))) {
        iVar5 = std::__cxx11::string::size();
        if ((local_110 < 0) ||
           (iVar5 + 1 +
            strings.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ < local_110)) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)((long)&s.field_2 + 8),(value_type *)local_968);
        }
      }
      output.field_2._8_8_ = (long)"PK\x01\x02" + 4;
      std::__cxx11::string::string((string *)&__range1);
      this = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&s.field_2 + 8);
      __end1 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(this);
      sr = (string *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(this);
      while (bVar3 = __gnu_cxx::operator!=
                               (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&sr), bVar3) {
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator*(&__end1);
        std::__cxx11::string::operator+=((string *)&__range1,(char *)output.field_2._8_8_);
        output.field_2._8_8_ = (long)":/\\;" + 3;
        __end2._M_current = (char *)std::__cxx11::string::begin();
        _Stack_a18._M_current = (char *)std::__cxx11::string::end();
        while (bVar3 = __gnu_cxx::operator!=(&__end2,&stack0xfffffffffffff5e8), bVar3) {
          pcVar17 = __gnu_cxx::
                    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator*(&__end2);
          cVar1 = *pcVar17;
          if (cVar1 == ';') {
            std::__cxx11::string::operator+=((string *)&__range1,'\\');
          }
          std::__cxx11::string::operator+=((string *)&__range1,cVar1);
          __gnu_cxx::
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator++(&__end2);
        }
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end1);
      }
      pcVar10 = cmExecutionStatus::GetMakefile(local_20);
      psVar11 = _maxlen;
      value = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&__range1);
      cmMakefile::AddDefinition(pcVar10,psVar11,value);
      args_local._7_1_ = 1;
      local_27c = 1;
      std::__cxx11::string::~string((string *)&__range1);
      std::__cxx11::string::~string((string *)local_968);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&s.field_2 + 8));
    }
    else {
      cmAlphaNum::cmAlphaNum(&local_8f0,"STRINGS file \"");
      cmAlphaNum::cmAlphaNum((cmAlphaNum *)&bytes_rem,(string *)local_78);
      cmStrCat<char[18]>(&local_8c0,&local_8f0,(cmAlphaNum *)&bytes_rem,
                         (char (*) [18])"\" cannot be read.");
      cmExecutionStatus::SetError(pcVar2,&local_8c0);
      std::__cxx11::string::~string((string *)&local_8c0);
      args_local._7_1_ = 0;
      local_27c = 1;
    }
    std::ifstream::~ifstream(&local_8a0);
LAB_003b094f:
    cmsys::RegularExpression::~RegularExpression((RegularExpression *)&encoding);
    std::__cxx11::string::~string((string *)local_78);
  }
  return (bool)(args_local._7_1_ & 1);
}

Assistant:

bool HandleStringsCommand(std::vector<std::string> const& args,
                          cmExecutionStatus& status)
{
  if (args.size() < 3) {
    status.SetError("STRINGS requires a file name and output variable");
    return false;
  }

  // Get the file to read.
  std::string fileName = args[1];
  if (!cmsys::SystemTools::FileIsFullPath(fileName)) {
    fileName =
      cmStrCat(status.GetMakefile().GetCurrentSourceDirectory(), '/', args[1]);
  }

  // Get the variable in which to store the results.
  std::string const& outVar = args[2];

  // Parse the options.
  enum
  {
    arg_none,
    arg_limit_input,
    arg_limit_output,
    arg_limit_count,
    arg_length_minimum,
    arg_length_maximum,
    arg_maximum,
    arg_regex,
    arg_encoding
  };
  unsigned int minlen = 0;
  unsigned int maxlen = 0;
  int limit_input = -1;
  int limit_output = -1;
  unsigned int limit_count = 0;
  cmsys::RegularExpression regex;
  bool have_regex = false;
  bool newline_consume = false;
  bool hex_conversion_enabled = true;
  enum
  {
    encoding_none = cmsys::FStream::BOM_None,
    encoding_utf8 = cmsys::FStream::BOM_UTF8,
    encoding_utf16le = cmsys::FStream::BOM_UTF16LE,
    encoding_utf16be = cmsys::FStream::BOM_UTF16BE,
    encoding_utf32le = cmsys::FStream::BOM_UTF32LE,
    encoding_utf32be = cmsys::FStream::BOM_UTF32BE
  };
  int encoding = encoding_none;
  int arg_mode = arg_none;
  for (unsigned int i = 3; i < args.size(); ++i) {
    if (args[i] == "LIMIT_INPUT") {
      arg_mode = arg_limit_input;
    } else if (args[i] == "LIMIT_OUTPUT") {
      arg_mode = arg_limit_output;
    } else if (args[i] == "LIMIT_COUNT") {
      arg_mode = arg_limit_count;
    } else if (args[i] == "LENGTH_MINIMUM") {
      arg_mode = arg_length_minimum;
    } else if (args[i] == "LENGTH_MAXIMUM") {
      arg_mode = arg_length_maximum;
    } else if (args[i] == "REGEX") {
      arg_mode = arg_regex;
    } else if (args[i] == "NEWLINE_CONSUME") {
      newline_consume = true;
      arg_mode = arg_none;
    } else if (args[i] == "NO_HEX_CONVERSION") {
      hex_conversion_enabled = false;
      arg_mode = arg_none;
    } else if (args[i] == "ENCODING") {
      arg_mode = arg_encoding;
    } else if (arg_mode == arg_limit_input) {
      if (sscanf(args[i].c_str(), "%d", &limit_input) != 1 ||
          limit_input < 0) {
        status.SetError(cmStrCat("STRINGS option LIMIT_INPUT value \"",
                                 args[i], "\" is not an unsigned integer."));
        return false;
      }
      arg_mode = arg_none;
    } else if (arg_mode == arg_limit_output) {
      if (sscanf(args[i].c_str(), "%d", &limit_output) != 1 ||
          limit_output < 0) {
        status.SetError(cmStrCat("STRINGS option LIMIT_OUTPUT value \"",
                                 args[i], "\" is not an unsigned integer."));
        return false;
      }
      arg_mode = arg_none;
    } else if (arg_mode == arg_limit_count) {
      int count;
      if (sscanf(args[i].c_str(), "%d", &count) != 1 || count < 0) {
        status.SetError(cmStrCat("STRINGS option LIMIT_COUNT value \"",
                                 args[i], "\" is not an unsigned integer."));
        return false;
      }
      limit_count = count;
      arg_mode = arg_none;
    } else if (arg_mode == arg_length_minimum) {
      int len;
      if (sscanf(args[i].c_str(), "%d", &len) != 1 || len < 0) {
        status.SetError(cmStrCat("STRINGS option LENGTH_MINIMUM value \"",
                                 args[i], "\" is not an unsigned integer."));
        return false;
      }
      minlen = len;
      arg_mode = arg_none;
    } else if (arg_mode == arg_length_maximum) {
      int len;
      if (sscanf(args[i].c_str(), "%d", &len) != 1 || len < 0) {
        status.SetError(cmStrCat("STRINGS option LENGTH_MAXIMUM value \"",
                                 args[i], "\" is not an unsigned integer."));
        return false;
      }
      maxlen = len;
      arg_mode = arg_none;
    } else if (arg_mode == arg_regex) {
      if (!regex.compile(args[i])) {
        status.SetError(cmStrCat("STRINGS option REGEX value \"", args[i],
                                 "\" could not be compiled."));
        return false;
      }
      have_regex = true;
      arg_mode = arg_none;
    } else if (arg_mode == arg_encoding) {
      if (args[i] == "UTF-8") {
        encoding = encoding_utf8;
      } else if (args[i] == "UTF-16LE") {
        encoding = encoding_utf16le;
      } else if (args[i] == "UTF-16BE") {
        encoding = encoding_utf16be;
      } else if (args[i] == "UTF-32LE") {
        encoding = encoding_utf32le;
      } else if (args[i] == "UTF-32BE") {
        encoding = encoding_utf32be;
      } else {
        status.SetError(cmStrCat("STRINGS option ENCODING \"", args[i],
                                 "\" not recognized."));
        return false;
      }
      arg_mode = arg_none;
    } else {
      status.SetError(
        cmStrCat("STRINGS given unknown argument \"", args[i], "\""));
      return false;
    }
  }

  if (hex_conversion_enabled) {
    // TODO: should work without temp file, but just on a memory buffer
    std::string binaryFileName =
      cmStrCat(status.GetMakefile().GetCurrentBinaryDirectory(),
               "/CMakeFiles/FileCommandStringsBinaryFile");
    if (cmHexFileConverter::TryConvert(fileName, binaryFileName)) {
      fileName = binaryFileName;
    }
  }

// Open the specified file.
#if defined(_WIN32) || defined(__CYGWIN__)
  cmsys::ifstream fin(fileName.c_str(), std::ios::in | std::ios::binary);
#else
  cmsys::ifstream fin(fileName.c_str());
#endif
  if (!fin) {
    status.SetError(
      cmStrCat("STRINGS file \"", fileName, "\" cannot be read."));
    return false;
  }

  // If BOM is found and encoding was not specified, use the BOM
  int bom_found = cmsys::FStream::ReadBOM(fin);
  if (encoding == encoding_none && bom_found != cmsys::FStream::BOM_None) {
    encoding = bom_found;
  }

  unsigned int bytes_rem = 0;
  if (encoding == encoding_utf16le || encoding == encoding_utf16be) {
    bytes_rem = 1;
  }
  if (encoding == encoding_utf32le || encoding == encoding_utf32be) {
    bytes_rem = 3;
  }

  // Parse strings out of the file.
  int output_size = 0;
  std::vector<std::string> strings;
  std::string s;
  while ((!limit_count || strings.size() < limit_count) &&
         (limit_input < 0 || static_cast<int>(fin.tellg()) < limit_input) &&
         fin) {
    std::string current_str;

    int c = fin.get();
    for (unsigned int i = 0; i < bytes_rem; ++i) {
      int c1 = fin.get();
      if (!fin) {
        fin.putback(static_cast<char>(c1));
        break;
      }
      c = (c << 8) | c1;
    }
    if (encoding == encoding_utf16le) {
      c = ((c & 0xFF) << 8) | ((c & 0xFF00) >> 8);
    } else if (encoding == encoding_utf32le) {
      c = (((c & 0xFF) << 24) | ((c & 0xFF00) << 8) | ((c & 0xFF0000) >> 8) |
           ((c & 0xFF000000) >> 24));
    }

    if (c == '\r') {
      // Ignore CR character to make output always have UNIX newlines.
      continue;
    }

    if (c >= 0 && c <= 0xFF &&
        (isprint(c) || c == '\t' || (c == '\n' && newline_consume))) {
      // This is an ASCII character that may be part of a string.
      // Cast added to avoid compiler warning. Cast is ok because
      // c is guaranteed to fit in char by the above if...
      current_str += static_cast<char>(c);
    } else if (encoding == encoding_utf8) {
      // Check for UTF-8 encoded string (up to 4 octets)
      static const unsigned char utf8_check_table[3][2] = {
        { 0xE0, 0xC0 },
        { 0xF0, 0xE0 },
        { 0xF8, 0xF0 },
      };

      // how many octets are there?
      unsigned int num_utf8_bytes = 0;
      for (unsigned int j = 0; num_utf8_bytes == 0 && j < 3; j++) {
        if ((c & utf8_check_table[j][0]) == utf8_check_table[j][1]) {
          num_utf8_bytes = j + 2;
        }
      }

      // get subsequent octets and check that they are valid
      for (unsigned int j = 0; j < num_utf8_bytes; j++) {
        if (j != 0) {
          c = fin.get();
          if (!fin || (c & 0xC0) != 0x80) {
            fin.putback(static_cast<char>(c));
            break;
          }
        }
        current_str += static_cast<char>(c);
      }

      // if this was an invalid utf8 sequence, discard the data, and put
      // back subsequent characters
      if ((current_str.length() != num_utf8_bytes)) {
        for (unsigned int j = 0; j < current_str.size() - 1; j++) {
          fin.putback(current_str[current_str.size() - 1 - j]);
        }
        current_str.clear();
      }
    }

    if (c == '\n' && !newline_consume) {
      // The current line has been terminated.  Check if the current
      // string matches the requirements.  The length may now be as
      // low as zero since blank lines are allowed.
      if (s.length() >= minlen && (!have_regex || regex.find(s))) {
        output_size += static_cast<int>(s.size()) + 1;
        if (limit_output >= 0 && output_size >= limit_output) {
          s.clear();
          break;
        }
        strings.push_back(s);
      }

      // Reset the string to empty.
      s.clear();
    } else if (current_str.empty()) {
      // A non-string character has been found.  Check if the current
      // string matches the requirements.  We require that the length
      // be at least one no matter what the user specified.
      if (s.length() >= minlen && !s.empty() &&
          (!have_regex || regex.find(s))) {
        output_size += static_cast<int>(s.size()) + 1;
        if (limit_output >= 0 && output_size >= limit_output) {
          s.clear();
          break;
        }
        strings.push_back(s);
      }

      // Reset the string to empty.
      s.clear();
    } else {
      s += current_str;
    }

    if (maxlen > 0 && s.size() == maxlen) {
      // Terminate a string if the maximum length is reached.
      if (s.length() >= minlen && (!have_regex || regex.find(s))) {
        output_size += static_cast<int>(s.size()) + 1;
        if (limit_output >= 0 && output_size >= limit_output) {
          s.clear();
          break;
        }
        strings.push_back(s);
      }
      s.clear();
    }
  }

  // If there is a non-empty current string we have hit the end of the
  // input file or the input size limit.  Check if the current string
  // matches the requirements.
  if ((!limit_count || strings.size() < limit_count) && !s.empty() &&
      s.length() >= minlen && (!have_regex || regex.find(s))) {
    output_size += static_cast<int>(s.size()) + 1;
    if (limit_output < 0 || output_size < limit_output) {
      strings.push_back(s);
    }
  }

  // Encode the result in a CMake list.
  const char* sep = "";
  std::string output;
  for (std::string const& sr : strings) {
    // Separate the strings in the output to make it a list.
    output += sep;
    sep = ";";

    // Store the string in the output, but escape semicolons to
    // make sure it is a list.
    for (char i : sr) {
      if (i == ';') {
        output += '\\';
      }
      output += i;
    }
  }

  // Save the output in a makefile variable.
  status.GetMakefile().AddDefinition(outVar, output);
  return true;
}